

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLNode * __thiscall tinyxml2::XMLNode::DeepClone(XMLNode *this,XMLDocument *target)

{
  XMLNode *this_00;
  int iVar1;
  undefined4 extraout_var;
  XMLNode *addThis;
  XMLNode **ppXVar2;
  XMLNode *this_01;
  
  iVar1 = (*this->_vptr_XMLNode[0xc])();
  this_01 = (XMLNode *)CONCAT44(extraout_var,iVar1);
  if (this_01 != (XMLNode *)0x0) {
    ppXVar2 = &this->_firstChild;
    while (this_00 = *ppXVar2, this_00 != (XMLNode *)0x0) {
      addThis = DeepClone(this_00,target);
      InsertEndChild(this_01,addThis);
      ppXVar2 = &this_00->_next;
    }
  }
  return this_01;
}

Assistant:

XMLNode* XMLNode::DeepClone(XMLDocument* target) const
{
	XMLNode* clone = this->ShallowClone(target);
	if (!clone) return 0;

	for (const XMLNode* child = this->FirstChild(); child; child = child->NextSibling()) {
		XMLNode* childClone = child->DeepClone(target);
		TIXMLASSERT(childClone);
		clone->InsertEndChild(childClone);
	}
	return clone;
}